

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall preciseUnitOps_inf_Test::~preciseUnitOps_inf_Test(preciseUnitOps_inf_Test *this)

{
  preciseUnitOps_inf_Test *this_local;
  
  ~preciseUnitOps_inf_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(preciseUnitOps, inf)
{
    EXPECT_FALSE(isinf(precise::invalid));
    EXPECT_FALSE(isinf(precise::defunit));
    EXPECT_FALSE(isinf(V));
    auto zunit = precise_unit(0.0, precise::m);
    auto nunit = precise::kg / zunit;
    EXPECT_TRUE(isinf(nunit));
    EXPECT_TRUE(isinf(precise_unit(nunit)));
}